

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall cmCMakePresetsGraph::ConfigurePreset::ConfigurePreset(ConfigurePreset *this)

{
  ConfigurePreset *this_local;
  
  Preset::Preset(&this->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__ConfigurePreset_011c5a08;
  std::__cxx11::string::string((string *)&this->Generator);
  std::__cxx11::string::string((string *)&this->Architecture);
  std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::optional(&this->ArchitectureStrategy);
  std::__cxx11::string::string((string *)&this->Toolset);
  std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::optional(&this->ToolsetStrategy);
  std::__cxx11::string::string((string *)&this->ToolchainFile);
  std::__cxx11::string::string((string *)&this->BinaryDir);
  std::__cxx11::string::string((string *)&this->InstallDir);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  ::map(&this->CacheVariables);
  std::optional<bool>::optional(&this->WarnDev);
  std::optional<bool>::optional(&this->ErrorDev);
  std::optional<bool>::optional(&this->WarnDeprecated);
  std::optional<bool>::optional(&this->ErrorDeprecated);
  std::optional<bool>::optional(&this->WarnUninitialized);
  std::optional<bool>::optional(&this->WarnUnusedCli);
  std::optional<bool>::optional(&this->WarnSystemVars);
  std::optional<bool>::optional(&this->DebugOutput);
  std::optional<bool>::optional(&this->DebugTryCompile);
  std::optional<bool>::optional(&this->DebugFind);
  return;
}

Assistant:

ConfigurePreset() = default;